

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

bool absl::lts_20250127::container_internal::operator==(const_iterator *a,const_iterator *b)

{
  const_iterator *pcVar1;
  const_iterator *in_RCX;
  const_iterator *pcVar2;
  const_iterator *in_RDX;
  
  if ((a == (const_iterator *)(kEmptyGroup + 0x10) || a == (const_iterator *)0x0) ||
     (-1 < *(char *)&(a->inner_).ctrl_)) {
    if ((in_RDX == (const_iterator *)(kEmptyGroup + 0x10) || in_RDX == (const_iterator *)0x0) ||
       (-1 < *(char *)&(in_RDX->inner_).ctrl_)) {
      if (a == (const_iterator *)(kEmptyGroup + 0x10) &&
          in_RDX == (const_iterator *)(kEmptyGroup + 0x10)) {
LAB_003aa3e6:
        return a == in_RDX;
      }
      if ((a == (const_iterator *)(kEmptyGroup + 0x10)) !=
          (in_RDX == (const_iterator *)(kEmptyGroup + 0x10))) goto LAB_003aa402;
      if (a == (const_iterator *)0x0 || in_RDX == (const_iterator *)0x0) goto LAB_003aa3e6;
      if ((in_RDX == (const_iterator *)kSooControl) == (a == (const_iterator *)kSooControl)) {
        if (a == (const_iterator *)kSooControl) {
          if (b == in_RCX) goto LAB_003aa3e6;
        }
        else {
          pcVar2 = in_RCX;
          pcVar1 = in_RDX;
          if (in_RDX < a) {
            pcVar2 = b;
            pcVar1 = a;
            b = in_RCX;
          }
          if ((pcVar1 < b) && (b <= pcVar2)) goto LAB_003aa3e6;
        }
      }
      operator==();
      goto LAB_003aa3f8;
    }
  }
  else {
LAB_003aa3f8:
    operator==();
  }
  operator==();
LAB_003aa402:
  operator==();
}

Assistant:

bool operator==(const const_iterator& a, const const_iterator& b) {
      return a.inner_ == b.inner_;
    }